

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddRgEa<(moira::Instr)4,(moira::Mode)8,(moira::Size)1>(Moira *this,u16 opcode)

{
  uint uVar1;
  byte bVar2;
  u32 addr;
  u32 uVar3;
  bool bVar4;
  u32 val;
  
  addr = computeEA<(moira::Mode)8,(moira::Size)1,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,addr);
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  val = uVar3 + (uVar1 & 0xff);
  bVar4 = (bool)((byte)(val >> 8) & 1);
  (this->reg).sr.c = bVar4;
  (this->reg).sr.x = bVar4;
  bVar2 = (byte)val;
  (this->reg).sr.v = (bool)((byte)(((byte)uVar3 ^ bVar2) & ((byte)uVar1 ^ bVar2)) >> 7);
  (this->reg).sr.z = bVar2 == 0;
  (this->reg).sr.n = (bool)(bVar2 >> 7);
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,addr,val);
  return;
}

Assistant:

void
Moira::execAddRgEa(u16 opcode)
{
    u32 ea, data, result;

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    result = addsub<I,S>(readD<S>(src), data);

    prefetch();
    writeM <M, S, POLLIPL> (ea, result);
}